

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O2

void __thiscall cfd::core::Block::Block(Block *this,Block *object)

{
  this->_vptr_Block = (_func_int **)&PTR__Block_00704588;
  ByteData::ByteData(&this->data_);
  BlockHeader::BlockHeader(&this->header_);
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  ByteData::operator=(&this->data_,&object->data_);
  BlockHeader::operator=(&this->header_,&object->header_);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (&this->txs_,&object->txs_);
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::operator=
            (&this->txids_,&object->txids_);
  return;
}

Assistant:

Block::Block(const Block& object) {
  data_ = object.data_;
  header_ = object.header_;
  txs_ = object.txs_;
  txids_ = object.txids_;
}